

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# g_scalar.c
# Opt level: O3

void scalar_displace(t_gobj *z,_glist *glist,int dx,int dy)

{
  t_pd s;
  int iVar1;
  int iVar2;
  t_template *x;
  t_symbol *ptVar3;
  t_float tVar4;
  t_float tVar5;
  int yonset;
  int xonset;
  t_symbol *zz;
  int ytype;
  int xtype;
  t_atom at [3];
  int local_98;
  int local_94;
  t_symbol *local_90;
  int local_88;
  int local_84;
  t_gobj *local_80;
  int local_78;
  _gstub *local_70;
  t_atom local_68;
  undefined4 local_58;
  float local_50;
  undefined4 local_48;
  float local_40;
  
  s = z[1].g_pd;
  x = template_findbyname((t_symbol *)s);
  if (x != (t_template *)0x0) {
    ptVar3 = gensym("x");
    iVar1 = template_find_field(x,ptVar3,&local_94,&local_84,&local_90);
    ptVar3 = gensym("y");
    iVar2 = template_find_field(x,ptVar3,&local_98,&local_88,&local_90);
    if ((iVar1 != 0) && (local_84 == 0)) {
      iVar1 = glist->gl_zoom;
      tVar4 = glist_pixelstox(glist,1.0);
      tVar5 = glist_pixelstox(glist,0.0);
      *(float *)((long)&z[1].g_next + (long)local_94) =
           (tVar4 - tVar5) * (float)(iVar1 * dx) + *(float *)((long)&z[1].g_next + (long)local_94);
    }
    if ((iVar2 != 0) && (local_88 == 0)) {
      iVar1 = glist->gl_zoom;
      tVar4 = glist_pixelstoy(glist,1.0);
      tVar5 = glist_pixelstoy(glist,0.0);
      *(float *)((long)&z[1].g_next + (long)local_98) =
           (tVar4 - tVar5) * (float)(iVar1 * dy) + *(float *)((long)&z[1].g_next + (long)local_98);
    }
    local_70 = glist->gl_stub;
    local_68.a_w.w_symbol = (t_symbol *)&local_80;
    local_78 = glist->gl_valid;
    local_70->gs_refcount = local_70->gs_refcount + 1;
    local_68.a_type = A_POINTER;
    local_50 = (float)dx;
    local_58 = 1;
    local_48 = 1;
    local_40 = (float)dy;
    local_80 = z;
    ptVar3 = gensym("displace");
    template_notify(x,ptVar3,2,&local_68);
    scalar_redraw((t_scalar *)z,glist);
    return;
  }
  pd_error((void *)0x0,"scalar: couldn\'t find template %s",s->c_name);
  return;
}

Assistant:

static void scalar_displace(t_gobj *z, t_glist *glist, int dx, int dy)
{
    t_scalar *x = (t_scalar *)z;
    t_symbol *templatesym = x->sc_template;
    t_template *template = template_findbyname(templatesym);
    t_symbol *zz;
    t_atom at[3];
    t_gpointer gp;
    int xonset, yonset, xtype, ytype, gotx, goty;
    if (!template)
    {
        pd_error(0, "scalar: couldn't find template %s", templatesym->s_name);
        return;
    }
    gotx = template_find_field(template, gensym("x"), &xonset, &xtype, &zz);
    if (gotx && (xtype != DT_FLOAT))
        gotx = 0;
    goty = template_find_field(template, gensym("y"), &yonset, &ytype, &zz);
    if (goty && (ytype != DT_FLOAT))
        goty = 0;
    if (gotx)
        *(t_float *)(((char *)(x->sc_vec)) + xonset) +=
            glist->gl_zoom * dx * (glist_pixelstox(glist, 1) - glist_pixelstox(glist, 0));
    if (goty)
        *(t_float *)(((char *)(x->sc_vec)) + yonset) +=
            glist->gl_zoom * dy * (glist_pixelstoy(glist, 1) - glist_pixelstoy(glist, 0));
    gpointer_init(&gp);
    gpointer_setglist(&gp, glist, x);
    SETPOINTER(&at[0], &gp);
    SETFLOAT(&at[1], (t_float)dx);
    SETFLOAT(&at[2], (t_float)dy);
    template_notify(template, gensym("displace"), 2, at);
    scalar_redraw(x, glist);
}